

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

void Abc_NtkDeleteObj_rec(Abc_Obj_t *pObj,int fOnlyNodes)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  long lVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11a,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 2) {
    __assert_fail("!Abc_ObjIsPi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11b,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  if ((pObj->vFanouts).nSize != 0) {
    __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x11c,"void Abc_NtkDeleteObj_rec(Abc_Obj_t *, int)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  Abc_NodeCollectFanins(pObj,vNodes);
  Abc_NtkDeleteObj(pObj);
  iVar2 = vNodes->nSize;
  if (fOnlyNodes == 0) {
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)vNodes->pArray[lVar4];
        if (((*(uint *)&pAVar1->field_0x14 & 0xf) != 2) && ((pAVar1->vFanouts).nSize == 0)) {
          Abc_NtkDeleteObj_rec(pAVar1,0);
          iVar2 = vNodes->nSize;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar2);
    }
  }
  else if (0 < iVar2) {
    lVar4 = 0;
    do {
      pAVar1 = (Abc_Obj_t *)vNodes->pArray[lVar4];
      if (((*(uint *)&pAVar1->field_0x14 & 0xf) == 7) && ((pAVar1->vFanouts).nSize == 0)) {
        Abc_NtkDeleteObj_rec(pAVar1,fOnlyNodes);
        iVar2 = vNodes->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  return;
}

Assistant:

void Abc_NtkDeleteObj_rec( Abc_Obj_t * pObj, int fOnlyNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( !Abc_ObjIsPi(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    if ( fOnlyNodes )
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    else
    {
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
            if ( !Abc_ObjIsPi(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
                Abc_NtkDeleteObj_rec( pObj, fOnlyNodes );
    }
    Vec_PtrFree( vNodes );
}